

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 hash_table_lookup_bkey_int32(hash_table_t *h,char *key,size_t len,int32 *val)

{
  undefined4 uStack_38;
  int32 rv;
  void *vval;
  int32 *val_local;
  size_t len_local;
  char *key_local;
  hash_table_t *h_local;
  
  vval = val;
  val_local = (int32 *)len;
  len_local = (size_t)key;
  key_local = (char *)h;
  h_local._4_4_ = hash_table_lookup_bkey(h,key,len,(void **)&uStack_38);
  if (h_local._4_4_ == 0) {
    if (vval != (void *)0x0) {
      *(undefined4 *)vval = uStack_38;
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int32
hash_table_lookup_bkey_int32(hash_table_t * h, const char *key, size_t len, int32 *val)
{
    void *vval;
    int32 rv;

    rv = hash_table_lookup_bkey(h, key, len, &vval);
    if (rv != 0)
        return rv;
    if (val)
        *val = (int32)(long)vval;
    return 0;
}